

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDP_Solver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pdVar1;
  bool bVar2;
  ostream *poVar3;
  DecPOMDPDiscreteInterface *pDVar4;
  NullPlanner *this;
  MDPPolicyIteration *this_00;
  pointer pdVar5;
  vector<double,_std::allocator<double>_> avgRewards;
  double r;
  string filename;
  string methodName;
  string timingsFilename;
  string local_690 [32];
  string local_670 [32];
  Timing Time;
  QTable q;
  unbounded_array<double,_std::allocator<double>_> local_600 [24];
  SimulationDecPOMDPDiscrete sim;
  string local_598 [32];
  stringstream ss;
  ostream local_568 [376];
  stringstream ss_1;
  ostream local_3e0 [376];
  Arguments args;
  
  ArgumentHandlers::Arguments::Arguments(&args);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  Timing::Timing(&Time);
  poVar3 = std::operator<<((ostream *)&std::cout,"Instantiating the problem...");
  std::endl<char,std::char_traits<char>>(poVar3);
  pDVar4 = (DecPOMDPDiscreteInterface *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&args);
  poVar3 = std::operator<<((ostream *)&std::cout,"...done.");
  std::endl<char,std::char_traits<char>>(poVar3);
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner(this,(long)args.horizon,pDVar4,(PlanningUnitMADPDiscreteParameters *)0x0)
  ;
  methodName._M_dataplus._M_p = (pointer)&methodName.field_2;
  methodName._M_string_length = 0;
  methodName.field_2._M_local_buf[0] = '\0';
  if (args.mmdp_method == ValueIteration) {
    this_00 = (MDPPolicyIteration *)operator_new(0x40);
    MDPValueIteration::MDPValueIteration
              ((MDPValueIteration *)this_00,(PlanningUnitDecPOMDPDiscrete *)this);
    std::__cxx11::string::assign((char *)&methodName);
    poVar3 = std::operator<<((ostream *)&std::cout,"Running value iteration...");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    if (args.mmdp_method != PolicyIteration) {
      if (args.mmdp_method == PolicyIterationGPU) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "No \'MDPPolicyIterationGPU\' available. Install cuda, reconfigure and recompile."
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Unkown mmdp_method");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      exit(1);
    }
    this_00 = (MDPPolicyIteration *)operator_new(0x40);
    MDPPolicyIteration::MDPPolicyIteration(this_00,(PlanningUnitDecPOMDPDiscrete *)this);
    poVar3 = std::operator<<((ostream *)&std::cout,"Running policy iteration...");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::assign((char *)&methodName);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"/dev/null",(allocator<char> *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&timingsFilename,"/dev/null",(allocator<char> *)&ss);
  if (args.dryrun == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    directories::MADPGetResultsFilename
              ((string *)&ss_1,(MultiAgentDecisionProcessInterface *)&methodName,
               (Arguments *)(pDVar4 + *(long *)(*(long *)pDVar4 + -0x40)));
    poVar3 = std::operator<<(local_568,(string *)&ss_1);
    poVar3 = std::operator<<(poVar3,"_h");
    std::ostream::operator<<(poVar3,args.horizon);
    std::__cxx11::string::~string((string *)&ss_1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&filename,(string *)&ss_1);
    std::__cxx11::string::~string((string *)&ss_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_1,
                   &filename,"_Timings");
    std::__cxx11::string::operator=((string *)&timingsFilename,(string *)&ss_1);
    std::__cxx11::string::~string((string *)&ss_1);
    bVar2 = file_exists(&filename);
    if (!bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"MMDP_Solver: could not open ");
      poVar3 = std::operator<<(poVar3,(string *)&filename);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"Results will not be stored to disk.");
      std::endl<char,std::char_traits<char>>(poVar3);
      args.dryrun = 1;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"Plan",(allocator<char> *)&ss_1);
  Timing::Start((string *)&Time);
  std::__cxx11::string::~string((string *)&ss);
  (**(code **)(*(long *)this_00 + 0x10))(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"Plan",(allocator<char> *)&ss_1);
  Timing::Stop((string *)&Time);
  std::__cxx11::string::~string((string *)&ss);
  poVar3 = std::operator<<((ostream *)&std::cout,"...done.");
  std::endl<char,std::char_traits<char>>(poVar3);
  (**(code **)(*(long *)this_00 + 0x50))(&q,this_00,0);
  poVar3 = std::operator<<((ostream *)&std::cout,"Simulating policy with nrRuns: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.nrRuns);
  poVar3 = std::operator<<(poVar3," and seed: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.randomSeed);
  std::endl<char,std::char_traits<char>>(poVar3);
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (&sim,(PlanningUnitDecPOMDPDiscrete *)this,args.nrRuns,args.randomSeed,false);
  if (args.dryrun == 0) {
    std::__cxx11::string::string(local_670,(string *)&filename);
    SimulationDecPOMDPDiscrete::SaveIntermediateResults(&sim,local_670);
    std::__cxx11::string::~string(local_670);
  }
  avgRewards.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  avgRewards.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  avgRewards.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  r = runOneSimulation(&q,(PlanningUnitDecPOMDPDiscrete *)this,&sim);
  poVar3 = std::operator<<((ostream *)&std::cout,"...done");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::vector<double,_std::allocator<double>_>::push_back(&avgRewards,&r);
  poVar3 = std::operator<<((ostream *)&std::cout,"Avg rewards: ");
  std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
  pdVar1 = avgRewards.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = avgRewards.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::operator<<(local_3e0,"< ");
  for (; pdVar5 != pdVar1; pdVar5 = pdVar5 + 1) {
    if (pdVar5 != avgRewards.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      std::operator<<(local_3e0,", ");
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::_M_insert<double>(*pdVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::operator<<(local_3e0,local_598);
    std::__cxx11::string::~string(local_598);
  }
  std::operator<<(local_3e0," >");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
  poVar3 = std::operator<<(poVar3,local_690);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_690);
  if (args.dryrun == 0) {
    Timing::Save((string *)&Time);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&avgRewards.super__Vector_base<double,_std::allocator<double>_>);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(&sim);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (local_600);
  std::__cxx11::string::~string((string *)&timingsFilename);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&methodName);
  Timing::~Timing(&Time);
  std::__cxx11::string::~string((string *)&args.maxplus_updateT);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    try
    {
        Timing Time;
        cout << "Instantiating the problem..."<<endl;
        DecPOMDPDiscreteInterface* decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);
        cout << "...done."<<endl;

        //construct MMDP_Solver
        PlanningUnitDecPOMDPDiscrete *np = new NullPlanner(args.horizon, decpomdp);
        MDPSolver *mdpSolver=NULL;
        string methodName;
        switch (args.mmdp_method)
        {
        case ArgumentHandlers::ValueIteration:
            mdpSolver=new MDPValueIteration(*np);
            methodName="MMDP_Solver_VI";
            cout << "Running value iteration..."<<endl;
            break;
        case ArgumentHandlers::PolicyIteration:
            mdpSolver=new MDPPolicyIteration(*np);
            cout << "Running policy iteration..."<<endl;
            methodName="MMDP_Solver_PI";
            break;
        case ArgumentHandlers::PolicyIterationGPU:
#if HAVE_CUDA_CUSOLVERDN_H
            mdpSolver=new MDPPolicyIterationGPU(*np);
            cout << "Running GPU supported policy iteration..."<<endl;
            methodName="MMDP_Solver_PIgpu";
#else
            cerr<<"No 'MDPPolicyIterationGPU' available. Install cuda, reconfigure and recompile."<<endl;
            exit(1);
#endif
            break;
        default:
            cerr<<"Unkown mmdp_method"<<endl;
            exit(1);
        }

        //set up output files
        string filename="/dev/null", timingsFilename="/dev/null";
        if(!args.dryrun)
        {
            stringstream ss;
            ss  << directories::MADPGetResultsFilename(methodName, *decpomdp, args)
                << "_h" << args.horizon;
            filename=ss.str();
            timingsFilename=filename + "_Timings";
            if(!file_exists(filename))
            {
                cout << "MMDP_Solver: could not open " << filename <<endl;
                cout << "Results will not be stored to disk." <<endl;
                args.dryrun = true;
            }
        }

        //start planning
        Time.Start("Plan");
        mdpSolver->Plan(); // calls PlanSlow() on MDPPolicyIteration and MDPPolicyIterationGPU objects

        Time.Stop("Plan");
        cout << "...done."<<endl;
        QTable q = mdpSolver->GetQTable(0); //<- infinite horizon, so get 1 value function of stage 0

        int nrRuns = args.nrRuns; //defaults to 1000, see argumentHandlers.h
        int seed = args.randomSeed; //defaults to 42
        cout << "Simulating policy with nrRuns: " << nrRuns << " and seed: " << seed <<endl;
        SimulationDecPOMDPDiscrete sim(*np, nrRuns, seed);

        //write intermediate simulation results to file
        if(!args.dryrun)
            sim.SaveIntermediateResults(filename);

        vector<double> avgRewards;
        double r = runOneSimulation(q, np, sim);
        cout << "...done"<<endl;

        avgRewards.push_back(r);
        cout << "Avg rewards: " << SoftPrintVector(avgRewards) << endl;

        //write MDPSOLVER timing information to file
        if(!args.dryrun)
            Time.Save(timingsFilename);
    }
    catch(E& e){ e.Print(); }

    return(0);
}